

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::compute_recall_lbest(recall_tree *b,node *n)

{
  node_pred *pnVar1;
  node_pred *pnVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  
  dVar5 = 0.0;
  if (0.0 < n->n) {
    pnVar1 = (n->preds)._begin;
    pnVar2 = pnVar1 + b->max_candidates;
    for (; (pnVar1 != (n->preds)._end && (pnVar1 < pnVar2)); pnVar1 = pnVar1 + 1) {
      dVar5 = dVar5 + pnVar1->label_count;
    }
    fVar4 = (float)n->n;
    fVar6 = (float)dVar5 / fVar4;
    fVar4 = ((1.0 - fVar6) * fVar6) / fVar4;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    dVar5 = n->n;
    fVar3 = b->bern_hyper;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = (fVar6 - fVar3 * fVar4) - (15.0 / ((float)dVar5 * 4.2426405)) * b->bern_hyper;
    if (fVar4 <= 0.0) {
      fVar4 = 0.0;
    }
    n->recall_lbest = fVar4;
  }
  return;
}

Assistant:

void compute_recall_lbest(recall_tree& b, node* n)
{
  if (n->n <= 0)
    return;

  double mass_at_k = 0;

  for (node_pred* ls = n->preds.begin(); ls != n->preds.end() && ls < n->preds.begin() + b.max_candidates; ++ls)
  {
    mass_at_k += ls->label_count;
  }

  float f = (float)mass_at_k / (float)n->n;
  float stdf = sqrt(f * (1.f - f) / (float)n->n);
  float diamf = 15.f / (sqrtf(18.f) * (float)n->n);

  // http://stackoverflow.com/questions/2789481/problem-calling-stdmax
  n->recall_lbest = (std::max)(0.f, f - sqrt(b.bern_hyper) * stdf - b.bern_hyper * diamf);
}